

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

bool xercesc_4_0::XMLUri::isValidRegistryBasedAuthority(XMLCh *authority,XMLSize_t authLen)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  
  for (uVar4 = 0; uVar4 < authLen; uVar4 = uVar4 + lVar3) {
    bVar1 = isUnreservedCharacter(authority[uVar4]);
    lVar3 = 1;
    if (!bVar1) {
      iVar2 = XMLString::indexOf((XMLCh *)REG_NAME_CHARACTERS,authority[uVar4]);
      if (iVar2 == -1) {
        if ((authority[uVar4] != L'%') || (authLen <= uVar4 + 2)) break;
        bVar1 = XMLString::isHex(authority[uVar4 + 1]);
        if (!bVar1) break;
        bVar1 = XMLString::isHex(authority[uVar4 + 2]);
        lVar3 = 3;
        if (!bVar1) break;
      }
    }
  }
  return authLen <= uVar4;
}

Assistant:

bool XMLUri::isValidRegistryBasedAuthority(const XMLCh* const authority,
                                           const XMLSize_t authLen)
{
    // check authority
    XMLSize_t index = 0;
    while (index < authLen)
    {
        if (isUnreservedCharacter(authority[index]) ||
            (XMLString::indexOf(REG_NAME_CHARACTERS, authority[index]) != -1))
        {
            index++;
        }
        else if (authority[index] == chPercent)               // '%'
        {
            if (index + 2 < authLen
                && XMLString::isHex(authority[index+1])       // 1st hex
                && XMLString::isHex(authority[index+2])  )    // 2nd hex
                index +=3;
            else
                return false;
        }
        else
            return false;
    } //while

    return true;
}